

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_> *this)

{
  TPZGeoEl *in_RDI;
  TPZGeoBlend<pzgeom::TPZGeoTriangle> *unaff_retaddr;
  int i;
  TPZGeoElSideIndex *in_stack_ffffffffffffff70;
  TPZGeoEl *local_60;
  TPZGeoElSideIndex local_40;
  int local_28;
  undefined8 local_18;
  undefined8 local_10;
  
  local_10 = 0;
  local_18 = 0x21;
  TPZRegisterClassId::
  TPZRegisterClassId<TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_02451c30);
  TPZGeoEl::TPZGeoEl(in_RDI,&PTR_PTR_02451c18);
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefLess_02451918;
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefLess_02451918;
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>::TPZGeoBlend(unaff_retaddr);
  local_60 = in_RDI + 0x24;
  do {
    TPZGeoElSideIndex::TPZGeoElSideIndex(in_stack_ffffffffffffff70);
    local_60 = (TPZGeoEl *)&local_60->fMatId;
  } while (local_60 != (TPZGeoEl *)&in_RDI[0x26].fFatherIndex);
  for (local_28 = 0; local_28 < 7; local_28 = local_28 + 1) {
    TPZGeoElSideIndex::TPZGeoElSideIndex(in_stack_ffffffffffffff70);
    TPZGeoElSideIndex::operator=
              ((TPZGeoElSideIndex *)(&in_RDI[0x24].field_0x0 + (long)local_28 * 0x18),&local_40);
    TPZGeoElSideIndex::~TPZGeoElSideIndex((TPZGeoElSideIndex *)0x16a6dfa);
  }
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess():TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId),
TPZGeoEl(){
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
}